

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialvalue.cpp
# Opt level: O2

void __thiscall
ConfidentialValue_Constractor_hex_err_Test::TestBody
          (ConfidentialValue_Constractor_hex_err_Test *this)

{
  bool bVar1;
  allocator local_59;
  string local_58;
  ConfidentialValue value;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_58,"001122",&local_59);
    cfd::core::ConfidentialValue::ConfidentialValue(&value,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    cfd::core::ConfidentialValue::~ConfidentialValue(&value);
  }
  testing::Message::Message((Message *)&value);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_58,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialvalue.cpp"
             ,0x5f,
             "Expected: ConfidentialValue value(\"001122\") throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_58,(Message *)&value);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_58);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&value);
  return;
}

Assistant:

TEST(ConfidentialValue, Constractor_hex_err) {
  // error
  EXPECT_THROW(ConfidentialValue value("001122"), CfdException);
}